

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

void __thiscall QPDF::insertXrefEntry(QPDF *this,int obj,int f0,qpdf_offset_t f1,int f2)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  int iVar2;
  size_type sVar3;
  _Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_> _Var4;
  QPDFExc *__return_storage_ptr__;
  pair<std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_bool> pVar5;
  int local_118;
  allocator<char> local_111;
  qpdf_offset_t local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  string local_c8;
  QPDFExc local_a8;
  
  iVar2 = 0;
  if (f0 != 2) {
    iVar2 = f2;
  }
  if ((((0 < obj) && (iVar2 < 0xffff)) && (-1 < f2)) &&
     (_Var1._M_head_impl =
           (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl,
     obj <= (_Var1._M_head_impl)->xref_table_max_id)) {
    local_118 = obj;
    local_110 = f1;
    sVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                      (&(_Var1._M_head_impl)->deleted_objects,&local_118);
    if (sVar3 == 0) {
      if ((int)f1 == local_118 && f0 == 2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e8,"xref stream",&local_111);
        std::__cxx11::to_string(&local_c8,local_118);
        std::operator+(&local_108,"self-referential object stream ",&local_c8);
        damagedPDF(&local_a8,this,&local_e8,&local_108);
        warn(this,&local_a8);
        QPDFExc::~QPDFExc(&local_a8);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_e8);
      }
      else {
        local_a8._0_4_ = local_118;
        local_a8._4_4_ = iVar2;
        pVar5 = std::
                map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                ::try_emplace<>(&((this->m)._M_t.
                                  super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                  .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                                 xref_table,(key_type *)&local_a8);
        _Var4 = pVar5.first._M_node;
        if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          if (f0 == 2) {
            iVar2 = QIntC::IntConverter<long_long,_int,_true,_true>::convert(&local_110);
            *(undefined4 *)&_Var4._M_node[1]._M_parent = 2;
            _Var4._M_node[1]._M_left = (_Base_ptr)(long)iVar2;
            *(int *)&_Var4._M_node[1]._M_right = f2;
          }
          else {
            if (f0 != 1) {
              __return_storage_ptr__ = (QPDFExc *)__cxa_allocate_exception(0x80);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_a8,"xref stream",(allocator<char> *)&local_c8);
              std::__cxx11::to_string(&local_108,f0);
              std::operator+(&local_e8,"unknown xref stream entry type ",&local_108);
              damagedPDF(__return_storage_ptr__,this,(string *)&local_a8,&local_e8);
              __cxa_throw(__return_storage_ptr__,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
            }
            *(undefined4 *)&_Var4._M_node[1]._M_parent = 1;
            _Var4._M_node[1]._M_left = (_Base_ptr)f1;
            *(undefined4 *)&_Var4._M_node[1]._M_right = 0;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
QPDF::insertXrefEntry(int obj, int f0, qpdf_offset_t f1, int f2)
{
    // Populate the xref table in such a way that the first reference to an object that we see,
    // which is the one in the latest xref table in which it appears, is the one that gets stored.
    // This works because we are reading more recent appends before older ones.

    // If there is already an entry for this object and generation in the table, it means that a
    // later xref table has registered this object.  Disregard this one.
    int new_gen = f0 == 2 ? 0 : f2;

    if (!(obj > 0 && obj <= m->xref_table_max_id && 0 <= f2 && new_gen < 65535)) {
        // We are ignoring invalid objgens. Most will arrive here from xref reconstruction. There
        // is probably no point having another warning but we could count invalid items in order to
        // decide when to give up.
        QTC::TC("qpdf", "QPDF xref overwrite invalid objgen");
        // ignore impossibly large object ids or object ids > Size.
        return;
    }

    if (m->deleted_objects.count(obj)) {
        QTC::TC("qpdf", "QPDF xref deleted object");
        return;
    }

    if (f0 == 2 && static_cast<int>(f1) == obj) {
        warn(damagedPDF("xref stream", "self-referential object stream " + std::to_string(obj)));
        return;
    }

    auto [iter, created] = m->xref_table.try_emplace(QPDFObjGen(obj, (f0 == 2 ? 0 : f2)));
    if (!created) {
        QTC::TC("qpdf", "QPDF xref reused object");
        return;
    }

    switch (f0) {
    case 1:
        // f2 is generation
        QTC::TC("qpdf", "QPDF xref gen > 0", ((f2 > 0) ? 1 : 0));
        iter->second = QPDFXRefEntry(f1);
        break;

    case 2:
        iter->second = QPDFXRefEntry(toI(f1), f2);
        break;

    default:
        throw damagedPDF("xref stream", "unknown xref stream entry type " + std::to_string(f0));
        break;
    }
}